

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_tools_particles.cxx
# Opt level: O1

void __thiscall level_tools::reconstruct_particles(level_tools *this)

{
  float fVar1;
  float fVar2;
  xr_level_ps_static *pxVar3;
  particle_data *ppVar4;
  char *pcVar5;
  char *pcVar6;
  xr_scene_particles *pxVar7;
  xr_particle_object *this_00;
  pointer pppVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  xr_name_gen name;
  xr_name_gen local_60;
  vector<xray_re::xr_custom_object*,std::allocator<xray_re::xr_custom_object*>> *local_50;
  pointer local_48;
  pointer local_40;
  xr_particle_object *local_38;
  
  if (this->m_level->m_ps_static != (xr_level_ps_static *)0x0) {
    xray_re::msg("building %s","ps.part");
    pxVar3 = this->m_level->m_ps_static;
    pxVar7 = xray_re::xr_scene::particles(this->m_scene);
    local_50 = (vector<xray_re::xr_custom_object*,std::allocator<xray_re::xr_custom_object*>> *)
               &(pxVar7->super_xr_scene_objects).m_objects;
    std::vector<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_>::reserve
              ((vector<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_> *)
               local_50,(long)(pxVar3->m_particles).
                              super__Vector_base<xray_re::particle_data_*,_std::allocator<xray_re::particle_data_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(pxVar3->m_particles).
                              super__Vector_base<xray_re::particle_data_*,_std::allocator<xray_re::particle_data_*>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3);
    xray_re::xr_name_gen::init(&local_60,(EVP_PKEY_CTX *)0x1e978a);
    pppVar8 = (pxVar3->m_particles).
              super__Vector_base<xray_re::particle_data_*,_std::allocator<xray_re::particle_data_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_48 = (pxVar3->m_particles).
               super__Vector_base<xray_re::particle_data_*,_std::allocator<xray_re::particle_data_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    while (pppVar8 != local_48) {
      ppVar4 = *pppVar8;
      local_40 = pppVar8;
      this_00 = (xr_particle_object *)operator_new(0x90);
      xray_re::xr_particle_object::xr_particle_object(this_00,this->m_scene);
      pcVar6 = local_60.m_name;
      pcVar5 = (char *)(this_00->super_xr_custom_object).m_name._M_string_length;
      strlen(local_60.m_name);
      std::__cxx11::string::_M_replace
                ((ulong)&(this_00->super_xr_custom_object).m_name,0,pcVar5,(ulong)pcVar6);
      (this_00->super_xr_custom_object).m_position.field_0.field_0.x =
           (ppVar4->xform).field_0.field_0._41;
      (this_00->super_xr_custom_object).m_position.field_0.field_0.y =
           (ppVar4->xform).field_0.field_0._42;
      (this_00->super_xr_custom_object).m_position.field_0.field_0.z =
           (ppVar4->xform).field_0.field_0._43;
      xray_re::_matrix<float>::get_hpb
                (&ppVar4->xform,&(this_00->super_xr_custom_object).m_rotation.field_0.field_0.y,
                 (float *)&(this_00->super_xr_custom_object).m_rotation,
                 &(this_00->super_xr_custom_object).m_rotation.field_0.field_0.z);
      fVar9 = (ppVar4->xform).field_0.field_0._11;
      fVar10 = (ppVar4->xform).field_0.field_0._12;
      fVar11 = (ppVar4->xform).field_0.field_0._13;
      fVar9 = fVar11 * fVar11 + fVar9 * fVar9 + fVar10 * fVar10;
      if (fVar9 < 0.0) {
        fVar9 = sqrtf(fVar9);
      }
      else {
        fVar9 = SQRT(fVar9);
      }
      fVar10 = (ppVar4->xform).field_0.field_0._21;
      fVar11 = (ppVar4->xform).field_0.field_0._22;
      fVar1 = (ppVar4->xform).field_0.field_0._23;
      fVar10 = fVar1 * fVar1 + fVar10 * fVar10 + fVar11 * fVar11;
      if (fVar10 < 0.0) {
        fVar10 = sqrtf(fVar10);
      }
      else {
        fVar10 = SQRT(fVar10);
      }
      fVar11 = (ppVar4->xform).field_0.field_0._31;
      fVar1 = (ppVar4->xform).field_0.field_0._32;
      fVar2 = (ppVar4->xform).field_0.field_0._33;
      fVar11 = fVar2 * fVar2 + fVar11 * fVar11 + fVar1 * fVar1;
      if (fVar11 < 0.0) {
        fVar11 = sqrtf(fVar11);
      }
      else {
        fVar11 = SQRT(fVar11);
      }
      (this_00->super_xr_custom_object).m_scale.field_0.field_0.x = fVar9;
      (this_00->super_xr_custom_object).m_scale.field_0.field_0.y = fVar10;
      (this_00->super_xr_custom_object).m_scale.field_0.field_0.z = fVar11;
      std::__cxx11::string::_M_assign((string *)&this_00->m_reference);
      local_38 = this_00;
      std::vector<xray_re::xr_custom_object*,std::allocator<xray_re::xr_custom_object*>>::
      emplace_back<xray_re::xr_custom_object*>(local_50,(xr_custom_object **)&local_38);
      pppVar8 = local_40 + 1;
      xray_re::xr_name_gen::next(&local_60);
    }
    xray_re::xr_level::clear_ps_static(this->m_level);
    if (local_60.m_name != (char *)0x0) {
      operator_delete(local_60.m_name,1);
    }
  }
  return;
}

Assistant:

void level_tools::reconstruct_particles()
{
	if (m_level->ps_static() == 0)
		return;
	msg("building %s", "ps.part");

	const particle_data_vec& particles = m_level->ps_static()->particles();

	xr_custom_object_vec& cobjects = m_scene->particles()->objects();
	cobjects.reserve(particles.size());

	xr_name_gen name("ps");
	for (particle_data_vec_cit it = particles.begin(), end = particles.end(); it != end; ++it, name.next()) {
		particle_data* ps = *it;
		xr_particle_object* new_ps = new xr_particle_object(*m_scene);
		new_ps->co_name() = name.get();
		new_ps->co_position().set(ps->xform.c);
		ps->xform.get_xyz(new_ps->co_rotation());
		// FIXME: this is not correct
		new_ps->co_scale().set(ps->xform.i.magnitude(),
				ps->xform.j.magnitude(), ps->xform.k.magnitude());
		new_ps->reference() = ps->reference;
		cobjects.push_back(new_ps);
	}
	m_level->clear_ps_static();
}